

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LzmaEnc.c
# Opt level: O0

SRes Flush(CLzmaEnc *p,UInt32 nowPos)

{
  SRes SVar1;
  undefined4 in_ESI;
  CLzmaEnc *in_RDI;
  CLzmaEnc *unaff_retaddr;
  undefined4 in_stack_fffffffffffffff0;
  
  in_RDI->finished = 1;
  if (in_RDI->writeEndMark != 0) {
    WriteEndMarker(unaff_retaddr,(UInt32)((ulong)in_RDI >> 0x20));
  }
  RangeEnc_FlushData((CRangeEnc *)CONCAT44(in_ESI,in_stack_fffffffffffffff0));
  RangeEnc_FlushStream((CRangeEnc *)CONCAT44(in_ESI,in_stack_fffffffffffffff0));
  SVar1 = CheckErrors(in_RDI);
  return SVar1;
}

Assistant:

static SRes Flush(CLzmaEnc *p, UInt32 nowPos)
{
  /* ReleaseMFStream(); */
  p->finished = True;
  if (p->writeEndMark)
    WriteEndMarker(p, nowPos & p->pbMask);
  RangeEnc_FlushData(&p->rc);
  RangeEnc_FlushStream(&p->rc);
  return CheckErrors(p);
}